

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  byte bVar1;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aVar2;
  params *ppVar3;
  uint *puVar4;
  color_quad_u8 *pcVar5;
  uint32 *puVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  int inten_table;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint c;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined4 local_68;
  uint uStack_64;
  uint uStack_60;
  undefined4 uStack_5c;
  uint local_54 [7];
  color_quad_u8 block_colors [4];
  uint block_inten_midpoints [3];
  
  ppVar3 = this->m_pParams;
  bVar1 = (coords->m_unscaled_color).field_0.field_0.r;
  uVar14 = (uint)bVar1;
  if (ppVar3->m_constrain_against_base_color5 == true) {
    iVar13 = uVar14 - (ppVar3->m_base_color5).field_0.field_0.r;
    iVar10 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar3->m_base_color5).field_0.field_0.g;
    iVar15 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar3->m_base_color5).field_0.field_0.b;
    iVar21 = iVar10;
    if (iVar13 < iVar10) {
      iVar21 = iVar13;
    }
    if (iVar15 <= iVar21) {
      iVar21 = iVar15;
    }
    if (-5 < iVar21) {
      if (iVar10 < iVar13) {
        iVar10 = iVar13;
      }
      if (iVar10 <= iVar15) {
        iVar10 = iVar15;
      }
      if (iVar10 < 4) goto LAB_0019db5c;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_0019db5c:
    if (coords->m_color4 == true) {
      uVar14 = uVar14 << 4 | uVar14;
      uVar11 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
      uVar11 = uVar11 << 4 | uVar11;
      uVar16 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
      uVar16 = uVar16 << 4 | uVar16;
    }
    else {
      uVar14 = uVar14 << 3 | (uint)(bVar1 >> 2);
      bVar1 = (coords->m_unscaled_color).field_0.field_0.g;
      uVar11 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
      bVar1 = (coords->m_unscaled_color).field_0.field_0.b;
      uVar16 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
    }
    if (0xfe < uVar14) {
      uVar14 = 0xff;
    }
    if (0xfe < uVar11) {
      uVar11 = 0xff;
    }
    uVar8 = 0xff;
    if (uVar16 < 0xff) {
      uVar8 = uVar16;
    }
    trial_solution->m_error = 0xffffffffffffffff;
    lVar12 = 7;
    uVar19 = 0xffffffffffffffff;
    do {
      iVar21 = (&g_etc1_inten_tables)[lVar12 * 4];
      iVar10 = (&DAT_001b9c54)[lVar12 * 4];
      iVar13 = *(int *)(&DAT_001b9c58 + lVar12 * 0x10);
      iVar15 = *(int *)(&DAT_001b9c5c + lVar12 * 0x10);
      uVar37 = -(uint)(0 < (int)(iVar21 + uVar14)) & iVar21 + uVar14;
      uVar22 = -(uint)(0 < (int)(iVar10 + uVar14)) & iVar10 + uVar14;
      uVar31 = -(uint)(0 < (int)(iVar13 + uVar14)) & iVar13 + uVar14;
      uVar38 = -(uint)(0 < (int)(iVar15 + uVar14)) & iVar15 + uVar14;
      uVar16 = -(uint)((int)uVar37 < 0xff);
      uVar24 = -(uint)((int)uVar22 < 0xff);
      uVar26 = -(uint)((int)uVar31 < 0xff);
      uVar28 = -(uint)((int)uVar38 < 0xff);
      uVar37 = uVar37 & uVar16;
      uVar38 = uVar38 & uVar28;
      uVar23 = ~uVar16 & 0xff;
      uVar29 = ~uVar28 & 0xff;
      local_68 = uVar23 | uVar37;
      uVar25 = ~uVar24 & 0xff | uVar22 & uVar24;
      uVar27 = ~uVar26 & 0xff | uVar31 & uVar26;
      uVar26 = -(uint)(0 < (int)(iVar21 + uVar11)) & iVar21 + uVar11;
      uVar31 = -(uint)(0 < (int)(iVar10 + uVar11)) & iVar10 + uVar11;
      uVar30 = -(uint)(0 < (int)(iVar13 + uVar11)) & iVar13 + uVar11;
      uVar32 = -(uint)(0 < (int)(iVar15 + uVar11)) & iVar15 + uVar11;
      uVar16 = -(uint)((int)uVar26 < 0xff);
      uVar24 = -(uint)((int)uVar31 < 0xff);
      uVar28 = -(uint)((int)uVar30 < 0xff);
      uVar22 = -(uint)((int)uVar32 < 0xff);
      uVar16 = ~uVar16 & 0xff | uVar26 & uVar16;
      uVar26 = ~uVar24 & 0xff | uVar31 & uVar24;
      uVar28 = ~uVar28 & 0xff | uVar30 & uVar28;
      uVar22 = ~uVar22 & 0xff | uVar32 & uVar22;
      uVar30 = -(uint)(0 < (int)(iVar21 + uVar8)) & iVar21 + uVar8;
      uVar32 = -(uint)(0 < (int)(iVar10 + uVar8)) & iVar10 + uVar8;
      uVar35 = -(uint)(0 < (int)(iVar13 + uVar8)) & iVar13 + uVar8;
      uVar36 = -(uint)(0 < (int)(iVar15 + uVar8)) & iVar15 + uVar8;
      uVar24 = -(uint)((int)uVar30 < 0xff);
      uVar31 = -(uint)((int)uVar32 < 0xff);
      uVar33 = -(uint)((int)uVar35 < 0xff);
      uVar34 = -(uint)((int)uVar36 < 0xff);
      uVar30 = ~uVar24 & 0xff | uVar30 & uVar24;
      uVar32 = ~uVar31 & 0xff | uVar32 & uVar31;
      uVar33 = ~uVar33 & 0xff | uVar35 & uVar33;
      uVar34 = ~uVar34 & 0xff | uVar36 & uVar34;
      uVar24 = uVar16 + local_68 + uVar30;
      iVar21 = uVar26 + uVar25 + uVar32;
      iVar10 = uVar28 + uVar27 + uVar33;
      uVar31 = uVar22 + (uVar29 | uVar38) + uVar34;
      local_68 = uVar16 << 8 | uVar30 << 0x10 | local_68;
      uVar22 = uVar22 << 8 | uVar34 << 0x10 | uVar29 | uVar38;
      uStack_64 = uVar26 << 8 | uVar32 << 0x10 | uVar25;
      uStack_60 = uVar28 << 8 | uVar33 << 0x10 | uVar27;
      uStack_5c = uVar22;
      local_54[0] = iVar21 + uVar24;
      local_54[1] = iVar21 + iVar10;
      local_54[2] = iVar10 + uVar31;
      puVar4 = this->m_pSorted_luma;
      pcVar5 = this->m_pParams->m_pSrc_pixels;
      uVar16 = puVar4[7];
      if (uVar16 * 2 < local_54[0]) {
        if ((uVar24 < uVar16 || uVar24 - uVar16 == 0) || (uVar24 - uVar16 < uVar19)) {
          this->m_temp_selectors[0] = '\0';
          this->m_temp_selectors[1] = '\0';
          this->m_temp_selectors[2] = '\0';
          this->m_temp_selectors[3] = '\0';
          this->m_temp_selectors[4] = '\0';
          this->m_temp_selectors[5] = '\0';
          this->m_temp_selectors[6] = '\0';
          this->m_temp_selectors[7] = '\0';
          lVar17 = 0;
          uVar9 = 0;
          do {
            iVar21 = (uVar23 | uVar37 & 0xff) - (uint)pcVar5[lVar17].field_0.field_0.r;
            iVar13 = (local_68 >> 8 & 0xff) - (uint)pcVar5[lVar17].field_0.field_0.g;
            iVar10 = (local_68 >> 0x10 & 0xff) - (uint)pcVar5[lVar17].field_0.field_0.b;
            uVar9 = uVar9 + (uint)(iVar10 * iVar10 + iVar13 * iVar13 + iVar21 * iVar21);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 8);
          goto LAB_0019df24;
        }
      }
      else {
        uVar16 = *puVar4;
        uStack_5c._1_1_ = (byte)(uVar22 >> 8);
        uStack_5c._2_1_ = (byte)(uVar22 >> 0x10);
        if (uVar16 * 2 < local_54[2]) {
          puVar6 = this->m_pSorted_luma_indices;
          uVar19 = 0;
          uVar16 = 0;
          uVar9 = 0;
          do {
            while (uVar18 = (ulong)uVar16, local_54[uVar18] <= puVar4[uVar19] * 2) {
              uVar16 = uVar16 + 1;
              if (2 < uVar16) {
                if (uVar19 < 8) {
                  do {
                    uVar16 = puVar6[uVar19];
                    this->m_temp_selectors[uVar16] = '\x03';
                    iVar10 = (uVar29 | uVar38 & 0xff) - (uint)pcVar5[uVar16].field_0.field_0.r;
                    iVar13 = (uint)uStack_5c._1_1_ - (uint)pcVar5[uVar16].field_0.field_0.g;
                    iVar21 = (uint)uStack_5c._2_1_ - (uint)pcVar5[uVar16].field_0.field_0.b;
                    uVar9 = uVar9 + (uint)(iVar21 * iVar21 + iVar13 * iVar13 + iVar10 * iVar10);
                    uVar19 = uVar19 + 1;
                  } while (uVar19 != 8);
                }
                goto LAB_0019df24;
              }
            }
            uVar24 = puVar6[uVar19];
            this->m_temp_selectors[uVar24] = (uint8)uVar16;
            iVar13 = (uint)*(byte *)(&local_68 + uVar18) - (uint)pcVar5[uVar24].field_0.field_0.r;
            iVar10 = (uint)*(byte *)((long)&local_68 + uVar18 * 4 + 1) -
                     (uint)pcVar5[uVar24].field_0.field_0.g;
            iVar21 = (uint)*(byte *)((long)&local_68 + uVar18 * 4 + 2) -
                     (uint)pcVar5[uVar24].field_0.field_0.b;
            uVar9 = uVar9 + (uint)(iVar21 * iVar21 + iVar10 * iVar10 + iVar13 * iVar13);
            uVar19 = uVar19 + 1;
          } while (uVar19 != 8);
        }
        else {
          if ((uVar31 <= uVar16 && uVar16 - uVar31 != 0) && (uVar19 <= uVar16 - uVar31))
          goto LAB_0019df4c;
          builtin_memcpy(this->m_temp_selectors,"\x03\x03\x03\x03\x03\x03\x03\x03",8);
          lVar17 = 0;
          uVar9 = 0;
          do {
            iVar21 = (uVar29 | uVar38 & 0xff) - (uint)pcVar5[lVar17].field_0.field_0.r;
            iVar13 = (uint)uStack_5c._1_1_ - (uint)pcVar5[lVar17].field_0.field_0.g;
            iVar10 = (uint)uStack_5c._2_1_ - (uint)pcVar5[lVar17].field_0.field_0.b;
            uVar9 = uVar9 + (uint)(iVar10 * iVar10 + iVar13 * iVar13 + iVar21 * iVar21);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 8);
        }
LAB_0019df24:
        uVar19 = trial_solution->m_error;
        if (uVar9 < trial_solution->m_error) {
          trial_solution->m_error = uVar9;
          (trial_solution->m_coords).m_inten_table = (uint)lVar12;
          *(undefined8 *)trial_solution->m_selectors = *(undefined8 *)this->m_temp_selectors;
          trial_solution->m_valid = true;
          uVar19 = uVar9;
          if (uVar9 == 0) {
            uVar19 = 0;
            break;
          }
        }
      }
LAB_0019df4c:
      bVar20 = lVar12 != 0;
      lVar12 = lVar12 + -1;
    } while (bVar20);
    aVar2 = (coords->m_unscaled_color).field_0;
    (trial_solution->m_coords).m_unscaled_color.field_0 = aVar2;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((pBest_solution != (potential_solution *)0x0) && (uVar19 < pBest_solution->m_error)) {
      (pBest_solution->m_coords).m_unscaled_color.field_0 = aVar2;
      (pBest_solution->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
      (pBest_solution->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
      uVar7 = *(undefined8 *)&trial_solution->field_0x14;
      *(undefined8 *)pBest_solution->m_selectors = *(undefined8 *)trial_solution->m_selectors;
      *(undefined8 *)&pBest_solution->field_0x14 = uVar7;
      *(undefined8 *)((long)&pBest_solution->m_error + 1) =
           *(undefined8 *)((long)&trial_solution->m_error + 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax)) {
      trial_solution.m_valid = false;
      return false;
    }
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    uint block_inten[4];
    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
      block_colors[s] = block_color;
      block_inten[s] = block_color.r + block_color.g + block_color.b;
    }

    // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
    // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
    // 0   1   2   3
    //   01  12  23
    const uint block_inten_midpoints[3] = {block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3]};

    uint64 total_error = 0;
    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0]) {
      if (block_inten[0] > m_pSorted_luma[n - 1]) {
        const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
        if (min_error >= trial_solution.m_error)
          continue;
      }

      memset(&m_temp_selectors[0], 0, n);

      for (uint c = 0; c < n; c++)
        total_error += block_colors[0].squared_distance_rgb(pSrc_pixels[c]);
    } else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2]) {
      if (m_pSorted_luma[0] > block_inten[3]) {
        const uint min_error = m_pSorted_luma[0] - block_inten[3];
        if (min_error >= trial_solution.m_error)
          continue;
      }

      memset(&m_temp_selectors[0], 3, n);

      for (uint c = 0; c < n; c++)
        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[c]);
    } else {
      uint cur_selector = 0, c;
      for (c = 0; c < n; c++) {
        const uint y = m_pSorted_luma[c];
        while ((y * 2) >= block_inten_midpoints[cur_selector])
          if (++cur_selector > 2)
            goto done;
        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
        m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
        total_error += block_colors[cur_selector].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
      }
    done:
      while (c < n) {
        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
        m_temp_selectors[sorted_pixel_index] = 3;
        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
        ++c;
      }
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, n);
      trial_solution.m_valid = true;
      if (!total_error)
        break;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}